

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.h
# Opt level: O0

float haarY_improved(integral_image *iimage,int row,int col,int s)

{
  int row_00;
  int in_ECX;
  int in_EDX;
  float fVar1;
  float fVar2;
  int col_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  row_00 = in_EDX - in_ECX / 2;
  col_00 = in_EDX;
  fVar1 = box_integral_improved
                    ((integral_image *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                     ,row_00,in_EDX,0,0x1a00f8);
  fVar2 = box_integral_improved
                    ((integral_image *)CONCAT44(in_EDX - in_ECX / 2,in_EDX),row_00,col_00,0,0x1a0151
                    );
  return fVar1 - fVar2;
}

Assistant:

inline float haarY_improved(struct integral_image *iimage, int row, int col, int s) {
    return box_integral_improved(iimage, row, col-s/2, s/2, s) - box_integral_improved(iimage, row-s/2, col-s/2, s/2, s);
}